

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

AstNode * parse_yindex(ParserState *parser)

{
  _Bool *p_Var1;
  uint uVar2;
  LexerState *ls;
  C_MemoryAllocator *pCVar3;
  AstNode *pAVar4;
  AstNode *pAVar5;
  BinaryOperatorType ignored;
  BinaryOperatorType local_1c;
  
  ls = parser->ls;
  raviX_next(ls);
  pAVar4 = parse_sub_expression(parser,0,&local_1c);
  checknext(ls,0x5d);
  uVar2 = parser->ls->lastline;
  pCVar3 = parser->compiler_state->allocator;
  pAVar5 = (AstNode *)(*pCVar3->calloc)(pCVar3->arena,1,0x50);
  pAVar5->type = EXPR_Y_INDEX;
  pAVar5->line_number = uVar2;
  p_Var1 = &(pAVar5->field_2).embedded_C_stmt.is_decl;
  *p_Var1 = (_Bool)(*p_Var1 & 0xfe);
  (pAVar5->field_2).common_expr.type.type_code = RAVI_TANY;
  (pAVar5->field_2).function_stmt.function_expr = pAVar4;
  (pAVar5->field_2).goto_stmt.name = (StringObject *)0x0;
  return pAVar5;
}

Assistant:

static AstNode *parse_yindex(ParserState *parser)
{
	LexerState *ls = parser->ls;
	/* index -> '[' expr ']' */
	raviX_next(ls); /* skip the '[' */
	AstNode *expr = parse_expression(parser);
	checknext(ls, ']');

	AstNode *index = allocate_expr_ast_node(parser, EXPR_Y_INDEX);
	index->index_expr.expr = expr;
	set_type(&index->index_expr.type, RAVI_TANY);
	return index;
}